

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::WaitScope::cancelAllDetached(WaitScope *this)

{
  Fault f;
  DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> _kjCondition;
  
  _kjCondition.left = &this->fiber;
  _kjCondition.result = (this->fiber).ptr == (FiberBase *)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    EventLoop::cancelAllDetached(this->loop);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[68]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x7a8,FAILED,"fiber == kj::none",
             "_kjCondition,\"can\'t call cancelAllDetached() on a fiber WaitScope, only top-level\""
             ,&_kjCondition,
             (char (*) [68])"can\'t call cancelAllDetached() on a fiber WaitScope, only top-level");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void WaitScope::cancelAllDetached() {
  KJ_REQUIRE(fiber == kj::none,
      "can't call cancelAllDetached() on a fiber WaitScope, only top-level");

  loop.cancelAllDetached();
}